

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::PrimMetas::authored(PrimMetas *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  bool local_11;
  PrimMetas *this_local;
  
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)this);
  local_11 = true;
  if (!bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->hidden);
    local_11 = true;
    if (!bVar1) {
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->kind);
      local_11 = true;
      if (!bVar1) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                          ((optional *)&this->customData);
        local_11 = true;
        if (!bVar1) {
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                            ((optional *)&this->references);
          local_11 = true;
          if (!bVar1) {
            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                              ((optional *)&this->payload);
            local_11 = true;
            if (!bVar1) {
              bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                ((optional *)&this->inherits);
              local_11 = true;
              if (!bVar1) {
                bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)&this->variants);
                local_11 = true;
                if (!bVar1) {
                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                    ((optional *)&this->variantSets);
                  local_11 = true;
                  if (!bVar1) {
                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                      ((optional *)&this->specializes);
                    local_11 = true;
                    if (!bVar1) {
                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                        ((optional *)&this->displayName);
                      local_11 = true;
                      if (!bVar1) {
                        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                          ((optional *)&this->sceneName);
                        local_11 = true;
                        if (!bVar1) {
                          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                            ((optional *)&this->doc);
                          local_11 = true;
                          if (!bVar1) {
                            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                              ((optional *)&this->comment);
                            local_11 = true;
                            if (!bVar1) {
                              sVar2 = std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::size(&this->unregisteredMetas);
                              local_11 = true;
                              if (sVar2 == 0) {
                                sVar3 = std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                        ::size(&this->meta);
                                local_11 = true;
                                if (sVar3 == 0) {
                                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                    ((optional *)&this->apiSchemas);
                                  local_11 = true;
                                  if (!bVar1) {
                                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                      ((optional *)&this->sdrMetadata);
                                    local_11 = true;
                                    if (!bVar1) {
                                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                        ((optional *)&this->assetInfo);
                                      local_11 = true;
                                      if (!bVar1) {
                                        bVar1 = nonstd::optional_lite::optional::
                                                operator_cast_to_bool
                                                          ((optional *)&this->instanceable);
                                        local_11 = true;
                                        if (!bVar1) {
                                          local_11 = nonstd::optional_lite::optional::
                                                     operator_cast_to_bool((optional *)&this->clips)
                                          ;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool authored() const {
    return (active || hidden || kind || customData || references || payload ||
            inherits || variants || variantSets || specializes || displayName ||
            sceneName || doc || comment || unregisteredMetas.size() || meta.size() || apiSchemas ||
            sdrMetadata || assetInfo || instanceable || clips);
  }